

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

Token * __thiscall
wabt::WastLexer::BareToken(Token *__return_storage_ptr__,WastLexer *this,TokenType token_type)

{
  Location loc;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  undefined4 uStack_c;
  
  uVar1 = (this->filename_)._M_dataplus;
  uVar2 = (this->filename_)._M_string_length;
  loc.filename.size_ = uVar2;
  loc.filename.data_ = (char *)uVar1;
  iVar3 = (*(int *)&this->token_start_ - *(int *)&this->line_start_) + 1;
  if (iVar3 < 2) {
    iVar3 = 1;
  }
  iVar4 = (*(int *)&this->cursor_ - *(int *)&this->line_start_) + 1;
  if (iVar4 < 2) {
    iVar4 = 1;
  }
  loc.field_1.field_0.first_column = iVar3;
  loc.field_1.field_0.line = this->line_;
  loc.field_1._12_4_ = uStack_c;
  loc.field_1.field_0.last_column = iVar4;
  Token::Token(__return_storage_ptr__,loc,token_type);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::BareToken(TokenType token_type) {
  return Token(GetLocation(), token_type);
}